

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  allocator<char> local_221;
  string local_220;
  CZString local_200;
  ArrayIndex local_1f0;
  ArrayIndex local_1ec;
  ArrayIndex index;
  ArrayIndex oldSize;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  ArrayIndex newSize_local;
  Value *this_local;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 6)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value((Value *)&index,arrayValue);
    operator=(this,(Value *)&index);
    ~Value((Value *)&index);
  }
  local_1ec = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else {
    local_1f0 = newSize;
    if (local_1ec < newSize) {
      operator[](this,newSize - 1);
    }
    else {
      for (; local_1f0 < local_1ec; local_1f0 = local_1f0 + 1) {
        this_00 = (this->value_).map_;
        CZString::CZString(&local_200,local_1f0);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::erase(this_00,&local_200);
        CZString::~CZString(&local_200);
      }
      AVar1 = size(this);
      if (AVar1 != newSize) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"assert json failed",&local_221);
        throwLogicError(&local_220);
      }
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}